

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.h
# Opt level: O0

DominatorTreeNode * __thiscall
spvtools::opt::DominatorTree::GetTreeNode(DominatorTree *this,uint32_t id)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  iterator node_iter;
  uint32_t id_local;
  DominatorTree *this_local;
  
  node_iter._M_node._4_4_ = id;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_spvtools::opt::DominatorTreeNode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_>_>
       ::find(&this->nodes_,(key_type *)((long)&node_iter._M_node + 4));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_spvtools::opt::DominatorTreeNode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_>_>
       ::end(&this->nodes_);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    this_local = (DominatorTree *)0x0;
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_>::
             operator->(&local_28);
    this_local = (DominatorTree *)&ppVar2->second;
  }
  return (DominatorTreeNode *)this_local;
}

Assistant:

inline DominatorTreeNode* GetTreeNode(uint32_t id) {
    DominatorTreeNodeMap::iterator node_iter = nodes_.find(id);
    if (node_iter == nodes_.end()) {
      return nullptr;
    }
    return &node_iter->second;
  }